

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

QFlags<Qt::AlignmentFlag> qvariant_cast<QFlags<Qt::AlignmentFlag>>(QVariant *v)

{
  bool bVar1;
  QMetaType QVar2;
  PrivateShared *pPVar3;
  long in_FS_OFFSET;
  QMetaType local_30;
  QMetaType local_28;
  undefined4 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QFlags<Qt::AlignmentFlag>_>::metaType;
  local_30.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar1 = comparesEqual(&local_30,&local_28);
  if (bVar1) {
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar3 = (v->d).data.shared;
      v = (QVariant *)(pPVar3 + *(int *)(pPVar3 + 4));
    }
  }
  else {
    local_1c = 0;
    QVar2.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    pPVar3 = (PrivateShared *)v;
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar3 = (v->d).data.shared;
      pPVar3 = pPVar3 + *(int *)(pPVar3 + 4);
    }
    v = (QVariant *)&local_1c;
    QMetaType::convert(QVar2,pPVar3,local_28,v);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
           (QFlagsStorage<Qt::AlignmentFlag>)
           *(QFlagsStorage<Qt::AlignmentFlag> *)&((Private *)&((PrivateShared *)v)->field_0x0)->data
    ;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}